

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
PossibleContentsTest_TestIntersectWithCombinations_Test::TestBody
          (PossibleContentsTest_TestIntersectWithCombinations_Test *this)

{
  allocator<wasm::PossibleContents> *this_00;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::PossibleContents> __l_00;
  size_type sVar1;
  size_type sVar2;
  undefined8 extraout_RDX;
  Array AVar3;
  pair<std::__detail::_Node_iterator<wasm::PossibleContents,_true,_true>,_bool> pVar4;
  PossibleContents *local_5c8;
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  local_5b0;
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  local_578;
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  local_540;
  undefined1 local_508 [8];
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  subsequent;
  PossibleContents local_4b8;
  Type local_498;
  Field local_490;
  Array local_480;
  HeapType local_470;
  Type local_468;
  Type arrayType;
  PossibleContents local_448;
  allocator<wasm::Field> local_421;
  Type local_420;
  Field local_418;
  iterator local_408;
  size_type local_400;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_3f8;
  Struct local_3e0;
  HeapType local_3c8;
  Type local_3c0;
  Type structType;
  PossibleContents local_3a0;
  PossibleContents local_380;
  PossibleContents local_360;
  PossibleContents local_340;
  PossibleContents local_320;
  PossibleContents local_300;
  PossibleContents local_2e0;
  PossibleContents local_2c0;
  PossibleContents local_2a0;
  PossibleContents local_280;
  PossibleContents local_260;
  PossibleContents local_240;
  PossibleContents local_220;
  PossibleContents local_200;
  PossibleContents local_1e0;
  PossibleContents local_1c0;
  PossibleContents local_1a0;
  PossibleContents local_180;
  PossibleContents local_160;
  PossibleContents local_140;
  PossibleContents local_120;
  PossibleContents local_100;
  PossibleContents local_e0;
  PossibleContents local_c0;
  PossibleContents local_a0;
  PossibleContents local_80;
  undefined1 local_60 [24];
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  initial;
  anon_class_1_0_00000001 doTest;
  PossibleContentsTest_TestIntersectWithCombinations_Test *this_local;
  
  ::wasm::PossibleContents::PossibleContents(&local_3a0,&(this->super_PossibleContentsTest).none);
  ::wasm::PossibleContents::PossibleContents(&local_380,&(this->super_PossibleContentsTest).f64One);
  ::wasm::PossibleContents::PossibleContents(&local_360,&(this->super_PossibleContentsTest).anyNull)
  ;
  ::wasm::PossibleContents::PossibleContents
            (&local_340,&(this->super_PossibleContentsTest).funcNull);
  ::wasm::PossibleContents::PossibleContents(&local_320,&(this->super_PossibleContentsTest).i31Null)
  ;
  ::wasm::PossibleContents::PossibleContents
            (&local_300,&(this->super_PossibleContentsTest).i32Global1);
  ::wasm::PossibleContents::PossibleContents
            (&local_2e0,&(this->super_PossibleContentsTest).i32Global2);
  ::wasm::PossibleContents::PossibleContents
            (&local_2c0,&(this->super_PossibleContentsTest).f64Global);
  ::wasm::PossibleContents::PossibleContents
            (&local_2a0,&(this->super_PossibleContentsTest).anyGlobal);
  ::wasm::PossibleContents::PossibleContents
            (&local_280,&(this->super_PossibleContentsTest).funcGlobal);
  ::wasm::PossibleContents::PossibleContents
            (&local_260,&(this->super_PossibleContentsTest).nonNullFuncGlobal);
  ::wasm::PossibleContents::PossibleContents
            (&local_240,&(this->super_PossibleContentsTest).nonNullFunc);
  ::wasm::PossibleContents::PossibleContents
            (&local_220,&(this->super_PossibleContentsTest).exactI32);
  ::wasm::PossibleContents::PossibleContents
            (&local_200,&(this->super_PossibleContentsTest).exactAnyref);
  ::wasm::PossibleContents::PossibleContents
            (&local_1e0,&(this->super_PossibleContentsTest).exactFuncref);
  ::wasm::PossibleContents::PossibleContents
            (&local_1c0,&(this->super_PossibleContentsTest).exactStructref);
  ::wasm::PossibleContents::PossibleContents
            (&local_1a0,&(this->super_PossibleContentsTest).exactI31ref);
  ::wasm::PossibleContents::PossibleContents
            (&local_180,&(this->super_PossibleContentsTest).exactNonNullAnyref);
  ::wasm::PossibleContents::PossibleContents
            (&local_160,&(this->super_PossibleContentsTest).exactNonNullFuncref);
  ::wasm::PossibleContents::PossibleContents
            (&local_140,&(this->super_PossibleContentsTest).exactNonNullI31ref);
  ::wasm::PossibleContents::PossibleContents
            (&local_120,&(this->super_PossibleContentsTest).exactFuncSignatureType);
  ::wasm::PossibleContents::PossibleContents
            (&local_100,&(this->super_PossibleContentsTest).exactNonNullFuncSignatureType);
  ::wasm::PossibleContents::PossibleContents(&local_e0,&(this->super_PossibleContentsTest).many);
  ::wasm::PossibleContents::PossibleContents
            (&local_c0,&(this->super_PossibleContentsTest).coneAnyref);
  ::wasm::PossibleContents::PossibleContents
            (&local_a0,&(this->super_PossibleContentsTest).coneFuncref);
  ::wasm::PossibleContents::PossibleContents
            (&local_80,&(this->super_PossibleContentsTest).coneFuncref1);
  local_60._0_8_ = &local_3a0;
  local_60._8_8_ = 0x1a;
  this_00 = (allocator<wasm::PossibleContents> *)((long)&structType.id + 1);
  std::allocator<wasm::PossibleContents>::allocator(this_00);
  __l_00._M_len = local_60._8_8_;
  __l_00._M_array = (iterator)local_60._0_8_;
  std::
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  ::unordered_set((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                   *)(local_60 + 0x10),__l_00,0,(hasher *)((long)&structType.id + 3),
                  (key_equal *)((long)&structType.id + 2),this_00);
  std::allocator<wasm::PossibleContents>::~allocator
            ((allocator<wasm::PossibleContents> *)((long)&structType.id + 1));
  local_5c8 = (PossibleContents *)local_60;
  do {
    local_5c8 = local_5c8 + -1;
    ::wasm::PossibleContents::~PossibleContents(local_5c8);
  } while (local_5c8 != &local_3a0);
  ::wasm::Type::Type(&local_420,i32);
  ::wasm::Field::Field(&local_418,local_420,Immutable);
  local_408 = &local_418;
  local_400 = 1;
  std::allocator<wasm::Field>::allocator(&local_421);
  __l._M_len = local_400;
  __l._M_array = local_408;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_3f8,__l,&local_421);
  ::wasm::Struct::Struct(&local_3e0,&local_3f8);
  ::wasm::HeapType::HeapType(&local_3c8,&local_3e0);
  ::wasm::Type::Type(&local_3c0,local_3c8,NonNullable,Inexact);
  ::wasm::Struct::~Struct(&local_3e0);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_3f8);
  std::allocator<wasm::Field>::~allocator(&local_421);
  ::wasm::PossibleContents::coneType(&local_448,local_3c0,0);
  pVar4 = std::
          unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
          ::insert((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                    *)(local_60 + 0x10),&local_448);
  arrayType.id = (uintptr_t)
                 pVar4.first.super__Node_iterator_base<wasm::PossibleContents,_true>._M_cur;
  ::wasm::PossibleContents::~PossibleContents(&local_448);
  ::wasm::Type::Type(&local_498,i32);
  ::wasm::Field::Field(&local_490,local_498,Immutable);
  ::wasm::Array::Array(&local_480,local_490);
  AVar3.element.packedType = (int)extraout_RDX;
  AVar3.element.mutable_ = (int)((ulong)extraout_RDX >> 0x20);
  AVar3.element.type.id = (uintptr_t)&local_480;
  ::wasm::HeapType::HeapType(&local_470,AVar3);
  ::wasm::Type::Type(&local_468,local_470,NonNullable,Inexact);
  ::wasm::PossibleContents::coneType(&local_4b8,local_468,0);
  pVar4 = std::
          unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
          ::insert((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                    *)(local_60 + 0x10),&local_4b8);
  subsequent._M_h._M_single_bucket =
       (__node_base_ptr)pVar4.first.super__Node_iterator_base<wasm::PossibleContents,_true>._M_cur;
  ::wasm::PossibleContents::~PossibleContents(&local_4b8);
  std::
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  ::unordered_set(&local_540,
                  (unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                   *)(local_60 + 0x10));
  TestBody::anon_class_1_0_00000001::operator()
            ((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
              *)local_508,(anon_class_1_0_00000001 *)((long)&initial._M_h._M_single_bucket + 7),
             &local_540);
  std::
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  ::~unordered_set(&local_540);
  while( true ) {
    sVar1 = std::
            unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
            ::size((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                    *)local_508);
    sVar2 = std::
            unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
            ::size((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                    *)(local_60 + 0x10));
    if (sVar1 <= sVar2) break;
    std::
    unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
    ::operator=((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                 *)(local_60 + 0x10),
                (unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                 *)local_508);
    std::
    unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
    ::unordered_set(&local_5b0,
                    (unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                     *)local_508);
    TestBody::anon_class_1_0_00000001::operator()
              (&local_578,(anon_class_1_0_00000001 *)((long)&initial._M_h._M_single_bucket + 7),
               &local_5b0);
    std::
    unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
    ::operator=((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                 *)local_508,&local_578);
    std::
    unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
    ::~unordered_set(&local_578);
    std::
    unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
    ::~unordered_set(&local_5b0);
  }
  std::
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  ::~unordered_set((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                    *)local_508);
  std::
  unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
  ::~unordered_set((unordered_set<wasm::PossibleContents,_std::hash<wasm::PossibleContents>,_std::equal_to<wasm::PossibleContents>,_std::allocator<wasm::PossibleContents>_>
                    *)(local_60 + 0x10));
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestIntersectWithCombinations) {
  // Whenever we combine C = A + B, both A and B must intersect with C. This
  // helper function gets a set of things and checks that property on them. It
  // returns the set of all contents it ever observed (see below for how we use
  // that).
  auto doTest = [](std::unordered_set<PossibleContents> set) {
    std::vector<PossibleContents> vec(set.begin(), set.end());

    // Find the maximum depths for the normalized cone tests later down.
    std::unordered_set<HeapType> heapTypes;
    for (auto& contents : set) {
      auto type = contents.getType();
      if (type.isRef()) {
        auto heapType = type.getHeapType();
        if (!heapType.isBasic()) {
          heapTypes.insert(heapType);
        }
      }
    }
    std::vector<HeapType> heapTypesVec(heapTypes.begin(), heapTypes.end());
    SubTypes subTypes(heapTypesVec);
    auto maxDepths = subTypes.getMaxDepths();

    // Go over all permutations up to a certain size (this quickly becomes
    // extremely slow, obviously, so keep this low).
    size_t max = 3;

    auto n = set.size();

    // |indexes| contains the indexes of the items in vec for the current
    // permutation.
    std::vector<size_t> indexes(max);
    std::fill(indexes.begin(), indexes.end(), 0);
    while (1) {
      // Test the current permutation: Combine all the relevant things, and then
      // check they all have an intersection.
      PossibleContents combination;
      for (auto index : indexes) {
        combination.combine(vec[index]);
      }
      // Note the combination in the set.
      set.insert(combination);
#if BINARYEN_TEST_DEBUG
      for (auto index : indexes) {
        std::cout << index << ' ';
        combination.combine(vec[index]);
      }
      std::cout << '\n';
#endif
      for (auto index : indexes) {
        auto item = vec[index];
        if (item.isNone()) {
          assertLackIntersection(combination, item);
          continue;
        }
#if BINARYEN_TEST_DEBUG
        if (!PossibleContents::haveIntersection(combination, item)) {
          std::cout << "\nFailure: no expected intersection. Indexes:\n";
          for (auto index : indexes) {
            std::cout << index << "\n  ";
            vec[index].dump(std::cout);
            std::cout << '\n';
          }
          std::cout << "combo:\n";
          combination.dump(std::cout);
          std::cout << "\ncompared item (index " << index << "):\n";
          item.dump(std::cout);
          std::cout << '\n';
          abort();
        }
#endif
        assertHaveIntersection(combination, item);

        auto type = combination.getType();
        if (type.isRef()) {
          // If we normalize the combination's depth, the item must still have
          // an intersection. That is, normalization must not have a bug that
          // results in cones that are too shallow.
          auto normalizedDepth = maxDepths[type.getHeapType()];
          auto normalizedCone =
            PossibleContents::coneType(type, normalizedDepth);
          assertHaveIntersection(normalizedCone, item);
        }

        // Test intersect() method, which is supported with a full cone type.
        // In that case we can test that the intersection of A with A + B is
        // simply A.
        if (combination.isFullConeType()) {
          auto intersection = item;
          intersection.intersect(combination);
          EXPECT_EQ(intersection, item);
#if BINARYEN_TEST_DEBUG
          if (intersection != item) {
            std::cout << "\nFailure: wrong intersection.\n";
            std::cout << "item: " << item << '\n';
            std::cout << "combination: " << combination << '\n';
            std::cout << "intersection: " << intersection << '\n';
            abort();
          }
#endif

          // The intersection is contained in each of the things we intersected
          // (but we can only compare to the full cone, as the API is restricted
          // to that).
          EXPECT_TRUE(
            PossibleContents::isSubContents(intersection, combination));
        }
      }

      // Move to the next permutation.
      size_t i = 0;
      while (1) {
        indexes[i]++;
        if (indexes[i] == n) {
          // Overflow.
          indexes[i] = 0;
          i++;
          if (i == max) {
            // All done.
            return set;
          }
        } else {
          break;
        }
      }
    }

    WASM_UNREACHABLE("loop above returns manually");
  };

  // Start from an initial set of the hardcoded contents we have in our test
  // fixture.
  std::unordered_set<PossibleContents> initial = {none,
                                                  f64One,
                                                  anyNull,
                                                  funcNull,
                                                  i31Null,
                                                  i32Global1,
                                                  i32Global2,
                                                  f64Global,
                                                  anyGlobal,
                                                  funcGlobal,
                                                  nonNullFuncGlobal,
                                                  nonNullFunc,
                                                  exactI32,
                                                  exactAnyref,
                                                  exactFuncref,
                                                  exactStructref,
                                                  exactI31ref,
                                                  exactNonNullAnyref,
                                                  exactNonNullFuncref,
                                                  exactNonNullI31ref,
                                                  exactFuncSignatureType,
                                                  exactNonNullFuncSignatureType,
                                                  many,
                                                  coneAnyref,
                                                  coneFuncref,
                                                  coneFuncref1};

  // Add some additional interesting types.
  auto structType =
    Type(HeapType(Struct({Field(Type::i32, Immutable)})), NonNullable);
  initial.insert(PossibleContents::coneType(structType, 0));
  auto arrayType =
    Type(HeapType(Array(Field(Type::i32, Immutable))), NonNullable);
  initial.insert(PossibleContents::coneType(arrayType, 0));

  // After testing on the initial contents, also test using anything new that
  // showed up while combining them.
  auto subsequent = doTest(initial);
  while (subsequent.size() > initial.size()) {
    initial = subsequent;
    subsequent = doTest(subsequent);
  }
}